

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriHelper.cpp
# Opt level: O3

Var Js::UriHelper::Encode
              (JavascriptString *strURI,uchar unescapedFlags,ScriptContext *scriptContext)

{
  byte bVar1;
  char16 cVar2;
  code *pcVar3;
  ScriptContext *scriptContext_00;
  bool bVar4;
  charcount_t cVar5;
  BOOL BVar6;
  char16 *pcVar7;
  Recycler *this;
  undefined4 *puVar8;
  char16 *content;
  JavascriptString *pJVar9;
  ulong uVar10;
  uint32 uVar11;
  int32 hCode;
  undefined7 in_register_00000031;
  char16 *pcVar12;
  uint cchUseLength;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  undefined1 local_88 [8];
  TrackAllocData data;
  byte local_48 [4];
  undefined4 local_44;
  BYTE bUTF8 [4];
  
  local_44 = (undefined4)CONCAT71(in_register_00000031,unescapedFlags);
  cVar5 = JavascriptString::GetLength(strURI);
  pcVar7 = JavascriptString::GetString(strURI);
  if (cVar5 != 0) {
    bVar4 = false;
    cchUseLength = 0;
    uVar10 = 0;
    _bUTF8 = scriptContext;
    do {
      uVar13 = (uint)uVar10;
      cVar2 = pcVar7[uVar10];
      uVar11 = (uint32)(ushort)cVar2;
      ValidateURIProps();
      if (((ulong)(ushort)cVar2 < 0x80) && (((&s_uriProps)[(ushort)cVar2] & (byte)local_44) != 0)) {
        cchUseLength = cchUseLength + 1;
        if (cchUseLength == 0) goto LAB_00d84b74;
      }
      else {
        if ((cVar2 & 0xfc00U) == 0xdc00) {
LAB_00d84b69:
          hCode = -0x7ff5ec60;
          goto LAB_00d84b82;
        }
        if (0xfbff < (ushort)(cVar2 + L'␀')) {
          uVar13 = uVar13 + 1;
          if ((uVar13 == cVar5) || ((ushort)(pcVar7[uVar13] + L'\x2000') < 0xfc00))
          goto LAB_00d84b69;
          uVar11 = (uint)(ushort)cVar2 * 0x400 + (uint)(ushort)pcVar7[uVar13] + 0xfca02400;
        }
        uVar11 = ToUTF8(uVar11,local_48);
        bVar4 = true;
        bVar15 = CARRY4(cchUseLength,uVar11 * 3);
        cchUseLength = cchUseLength + uVar11 * 3;
        if (bVar15) goto LAB_00d84b74;
      }
      uVar10 = (ulong)(uVar13 + 1);
    } while (uVar13 + 1 < cVar5);
    scriptContext = _bUTF8;
    if (bVar4) {
      if (cchUseLength == 0xffffffff) {
LAB_00d84b74:
        ::Math::DefaultOverflowPolicy();
      }
      uVar10 = (ulong)cchUseLength;
      data.plusSize = uVar10 + 1;
      local_88 = (undefined1  [8])&char16_t::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_933a3ad;
      data.filename._0_4_ = 0xbf;
      this = Memory::Recycler::TrackAllocInfo(_bUTF8->recycler,(TrackAllocData *)local_88);
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00d84b89;
        *puVar8 = 0;
      }
      content = (char16 *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                          (this,uVar10 * 2 + 2);
      if (content == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) goto LAB_00d84b89;
        *puVar8 = 0;
      }
      uVar14 = 0;
      pcVar12 = content;
      data._32_8_ = uVar10;
      do {
        uVar13 = (uint)uVar14;
        cVar2 = pcVar7[uVar14];
        uVar11 = (uint32)(ushort)cVar2;
        ValidateURIProps();
        if (((ulong)(ushort)cVar2 < 0x80) && (((&s_uriProps)[(ushort)cVar2] & (byte)local_44) != 0))
        {
          *pcVar12 = cVar2;
          pcVar12 = pcVar12 + 1;
        }
        else {
          if ((cVar2 & 0xfc00U) == 0xdc00) {
LAB_00d84b79:
            hCode = -0x7ff5ffcd;
LAB_00d84b82:
            JavascriptError::ThrowURIError(_bUTF8,hCode,(PCWSTR)0x0);
          }
          if (0xfbff < (ushort)(cVar2 + L'␀')) {
            uVar13 = uVar13 + 1;
            if ((uVar13 == cVar5) || ((ushort)(pcVar7[uVar13] + L'\x2000') < 0xfc00))
            goto LAB_00d84b79;
            uVar11 = (uint)(ushort)cVar2 * 0x400 + (uint)(ushort)pcVar7[uVar13] + 0xfca02400;
          }
          uVar11 = ToUTF8(uVar11,local_48);
          uVar10 = 0;
          do {
            bVar1 = local_48[uVar10];
            *pcVar12 = L'%';
            pcVar12[1] = L"0123456789ABCDEF"[bVar1 >> 4];
            pcVar12[2] = L"0123456789ABCDEF"[bVar1 & 0xf];
            pcVar12 = pcVar12 + 3;
            uVar10 = uVar10 + 1;
          } while (uVar11 != uVar10);
        }
        scriptContext_00 = _bUTF8;
        uVar14 = (ulong)(uVar13 + 1);
      } while (uVar13 + 1 < cVar5);
      pcVar7 = content + data._32_8_;
      if (pcVar7 == pcVar12) {
LAB_00d84adc:
        *pcVar7 = L'\0';
        pJVar9 = JavascriptString::NewWithBuffer(content,cchUseLength,scriptContext_00);
        return pJVar9;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                  ,0xf9,"(outURI + outputLen == outCurrent)",
                                  " URI out buffer out of sync");
      if (bVar4) {
        *puVar8 = 0;
        goto LAB_00d84adc;
      }
      goto LAB_00d84b89;
    }
  }
  if ((((((strURI->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).scriptContext.ptr != scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                ,0xb8,"(scriptContext == strURI->GetScriptContext())",
                                "Should have already marshaled the string in cross site thunk");
    if (!bVar4) {
LAB_00d84b89:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  return strURI;
}

Assistant:

Var UriHelper::Encode(JavascriptString* strURI, unsigned char unescapedFlags, ScriptContext* scriptContext )
    {
        charcount_t len = strURI->GetLength();
        __in_ecount(len) const char16* input = strURI->GetString();
        bool needsChanges = false;
        BYTE bUTF8[MaxUTF8Len];

        // pass 1 calculate output length and error check
        uint32 outputLen = 0;
        for( uint32 k = 0; k < len; k++ )
        {
            char16 c = input[k];
            uint32 uVal;
            if( InURISet(c, unescapedFlags) )
            {
                outputLen = UInt32Math::Add(outputLen, 1);
            }
            else
            {
                needsChanges = true;

                if( c >= 0xDC00 && c <= 0xDFFF )
                {
                    JavascriptError::ThrowURIError(scriptContext, JSERR_URIEncodeError /* TODO-ERROR: _u("NEED MESSAGE") */);
                }
                else if( c < 0xD800 || c > 0xDBFF )
                {
                    uVal = (uint32)c;
                }
                else
                {
                    ++k;
                    if(k == len)
                    {
                        JavascriptError::ThrowURIError(scriptContext, JSERR_URIEncodeError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
                    __analysis_assume(k < len); // because we throw exception if k==len
                    char16 c1 = input[k];
                    if( c1 < 0xDC00 || c1 > 0xDFFF )
                    {
                        JavascriptError::ThrowURIError(scriptContext, JSERR_URIEncodeError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
                    uVal = (c - 0xD800) * 0x400 + (c1 - 0xDC00) + 0x10000;
                }
                uint32 utfLen = ToUTF8(uVal, bUTF8);
                utfLen = UInt32Math::Mul(utfLen, 3);
                outputLen = UInt32Math::Add(outputLen, utfLen);
            }
        }

        // If nothing needs encoding, then avoid extra work
        if (!needsChanges)
        {
            AssertMsg(scriptContext == strURI->GetScriptContext(), "Should have already marshaled the string in cross site thunk");
            return strURI;
        }

        //pass 2 generate the encoded URI

        uint32 allocSize = UInt32Math::Add(outputLen, 1);
        char16* outURI = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, allocSize);
        char16* outCurrent = outURI;
        const char16 *hexStream = _u("0123456789ABCDEF");

        for( uint32 k = 0; k < len; k++ )
        {
            char16 c = input[k];
            uint32 uVal;
            if( InURISet(c, unescapedFlags) )
            {
                __analysis_assume(outCurrent < outURI + allocSize);
                *outCurrent++ = c;
            }
            else
            {
#if DBG
                if( c >= 0xDC00 && c <= 0xDFFF )
                {
                    JavascriptError::ThrowURIError(scriptContext, VBSERR_InternalError /* TODO-ERROR: _u("NEED MESSAGE") */);
                }
#endif
                if( c < 0xD800 || c > 0xDBFF )
                {
                    uVal = (uint32)c;
                }
                else
                {
                    ++k;
#if DBG
                    if(k == len)
                    {
                        JavascriptError::ThrowURIError(scriptContext, VBSERR_InternalError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
#endif
                    __analysis_assume(k < len);// because we throw exception if k==len
                    char16 c1 = input[k];

#if DBG
                    if( c1 < 0xDC00 || c1 > 0xDFFF )
                    {
                        JavascriptError::ThrowURIError(scriptContext, VBSERR_InternalError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
#endif
                    uVal = (c - 0xD800) * 0x400 + (c1 - 0xDC00) + 0x10000;
                }

                uint32 utfLen = ToUTF8(uVal, bUTF8);
                for( uint32 j = 0; j < utfLen; j++ )
                {
#pragma prefast(disable: 26014, "buffer length was calculated earlier");
                    BYTE val = bUTF8[j];
                    *outCurrent++ = _u('%');
                    *outCurrent++ = hexStream[(val >> 4)];
                    *outCurrent++ = hexStream[(val & 0xF)];
#pragma prefast(default: 26014);
                }
            }
        }
        AssertMsg(outURI + outputLen == outCurrent, " URI out buffer out of sync");
        __analysis_assume(outputLen + 1 == allocSize);
        outURI[outputLen] = _u('\0');

        return JavascriptString::NewWithBuffer(outURI, outputLen, scriptContext);
    }